

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMP_Next.cpp
# Opt level: O2

void get_nextval(string *t)

{
  ulong uVar1;
  pointer pcVar2;
  ostream *this;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  int iVar6;
  int k;
  ulong uVar7;
  ulong uVar8;
  
  memset(nextval,0x3f,0x194);
  nextval[1] = 0;
  uVar1 = t->_M_string_length;
  uVar4 = 1;
  uVar7 = 0;
  do {
    uVar8 = uVar4 & 0xffffffff;
    while( true ) {
      if (uVar1 <= uVar8) {
        for (uVar7 = 1; uVar7 < uVar8; uVar7 = uVar7 + 1) {
          pcVar5 = " ";
          if (uVar7 == 1) {
            pcVar5 = "nextval:";
          }
          this = std::operator<<((ostream *)&std::cout,pcVar5);
          lVar3 = *(long *)this;
          *(uint *)(this + *(long *)(lVar3 + -0x18) + 0x18) =
               *(uint *)(this + *(long *)(lVar3 + -0x18) + 0x18) | 0x80;
          *(undefined8 *)(this + *(long *)(lVar3 + -0x18) + 0x10) = 2;
          std::ostream::operator<<(this,nextval[uVar7]);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        return;
      }
      pcVar2 = (t->_M_dataplus)._M_p;
      lVar3 = (long)(int)uVar7;
      if (((int)uVar7 == 0) || (pcVar2[uVar8] == pcVar2[lVar3])) break;
      uVar7 = (ulong)(uint)nextval[lVar3];
    }
    uVar7 = lVar3 + 1;
    iVar6 = (int)uVar7;
    if (pcVar2[uVar8 + 1] == pcVar2[lVar3 + 1]) {
      iVar6 = nextval[lVar3 + 1];
    }
    uVar4 = uVar8 + 1;
    nextval[uVar8 + 1] = iVar6;
  } while( true );
}

Assistant:

void get_nextval(string t) { //nudt的next
    ms(nextval,INF);
    int i = 1, j = 0;
    nextval[1] = 0;
    while(i < t.length()) {
        if(j==0 || t[i]==t[j]) {
            ++i; ++j;
            nextval[i] = (t[i]==t[j])?nextval[j]:j;
        } else {
            j = nextval[j];
        }
    }
    for(int k = 1; k < i; k++) {
        cout << (k==1?"nextval:":" ") << setiosflags(ios::right) << setw(2) << nextval[k];
    }
    cout << endl;
}